

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

TidyMessageImpl *
formatStandard(TidyDocImpl *doc,Node *element,Node *node,uint code,uint level,__va_list_tag *args)

{
  uint uVar1;
  TidyMessageImpl *pTVar2;
  long *plVar3;
  uint *puVar4;
  ctmbstr ptVar5;
  undefined8 *puVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  undefined8 uVar10;
  Node *node_00;
  uint messageType;
  tmbstr ptVar11;
  undefined8 uVar12;
  ctmbstr ptVar13;
  char nodedesc [256];
  char elemdesc [256];
  char local_238 [256];
  char local_138 [264];
  
  memset(local_238,0,0x100);
  memset(local_138,0,0x100);
  TagToString(node,local_238,0x100);
  node_00 = node;
  if (element != (Node *)0x0) {
    TagToString(element,local_138,0x100);
    node_00 = element;
  }
  pTVar2 = (TidyMessageImpl *)0x0;
  switch(code) {
  case 0x222:
  case 0x22d:
  case 0x264:
  case 0x270:
  case 0x271:
  case 0x28b:
  case 0x28c:
    ptVar11 = local_238;
    goto LAB_00151a99;
  case 0x225:
  case 0x25f:
  case 0x260:
  case 0x282:
  case 0x28d:
    uVar1 = args->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      plVar3 = (long *)((ulong)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      plVar3 = (long *)args->overflow_arg_area;
      args->overflow_arg_area = plVar3 + 1;
    }
    pcVar9 = "NULL";
    if ((char *)*plVar3 != (char *)0x0) {
      pcVar9 = (char *)*plVar3;
    }
    goto LAB_00151ba1;
  case 0x22c:
  case 0x233:
  case 0x236:
  case 0x237:
  case 0x24f:
  case 0x250:
  case 0x251:
  case 0x252:
  case 0x253:
  case 600:
  case 0x262:
  case 0x265:
  case 0x27d:
  case 0x291:
    node = node_00;
    goto LAB_00151976;
  case 0x22e:
  case 0x22f:
  case 0x230:
    uVar1 = args->gp_offset;
    uVar7 = (ulong)uVar1;
    if (uVar7 < 0x29) {
      args->gp_offset = (uint)(uVar7 + 8);
      uVar8 = (ulong)*(uint *)((long)args->reg_save_area + uVar7);
      if (0x20 < uVar1) goto LAB_00151b60;
      puVar4 = (uint *)(uVar7 + 8 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 0x10;
    }
    else {
      puVar4 = (uint *)args->overflow_arg_area;
      args->overflow_arg_area = puVar4 + 2;
      uVar8 = (ulong)*puVar4;
LAB_00151b60:
      puVar4 = (uint *)args->overflow_arg_area;
      args->overflow_arg_area = puVar4 + 2;
    }
    pTVar2 = prvTidytidyMessageCreateWithLexer(doc,code,level,uVar8,(ulong)*puVar4);
    break;
  case 0x231:
  case 0x267:
  case 0x28e:
    ptVar11 = local_238;
    node_00 = node;
    goto LAB_00151a99;
  case 0x232:
  case 0x268:
  case 0x27f:
    ptVar13 = node->element;
    node = node_00;
    ptVar5 = ptVar13;
    goto LAB_00151d88;
  case 0x234:
    uVar7 = (doc->config).value[0x56].v - 1;
    messageType = 0x204;
    if (uVar7 < 3) {
      messageType = (int)uVar7 + 0x201;
    }
    ptVar5 = tidyLocalizedString(messageType);
    ptVar13 = local_138;
    code = 0x234;
    node = element;
    goto LAB_00151d88;
  case 0x238:
  case 0x241:
  case 0x243:
  case 0x263:
  case 0x281:
  case 0x284:
    ptVar11 = local_138;
    goto LAB_00151a99;
  case 0x239:
  case 0x23a:
    ptVar5 = HTMLVersion((TidyDocImpl *)(ulong)doc->lexer->doctype);
    ptVar13 = local_238;
    goto LAB_00151d88;
  case 0x23d:
  case 0x23e:
  case 0x23f:
  case 0x276:
  case 0x278:
  case 0x279:
  case 0x27a:
    uVar1 = args->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      plVar3 = (long *)((ulong)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      plVar3 = (long *)args->overflow_arg_area;
      args->overflow_arg_area = plVar3 + 1;
    }
    if (*plVar3 != 0) {
      pTVar2 = prvTidytidyMessageCreate(doc,code,level);
      return pTVar2;
    }
LAB_00151d91:
    pTVar2 = (TidyMessageImpl *)0x0;
    break;
  case 0x247:
  case 0x261:
  case 0x280:
  case 0x285:
  case 0x287:
    ptVar11 = node->element;
    node_00 = node;
    goto LAB_00151a99;
  case 599:
    uVar1 = args->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      plVar3 = (long *)((ulong)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      plVar3 = (long *)args->overflow_arg_area;
      args->overflow_arg_area = plVar3 + 1;
    }
    ptVar5 = (ctmbstr)*plVar3;
    if (ptVar5 == (ctmbstr)0x0) goto LAB_00151d91;
    ptVar13 = local_238;
    code = 599;
    goto LAB_00151d88;
  case 0x259:
    ptVar13 = element->element;
    ptVar5 = local_238;
    code = 0x259;
    node = node_00;
    goto LAB_00151d88;
  case 0x25a:
  case 0x25b:
  case 0x26d:
    ptVar11 = element->element;
LAB_00151a99:
    pTVar2 = prvTidytidyMessageCreateWithNode(doc,node_00,code,level,ptVar11);
    break;
  case 0x269:
  case 0x273:
  case 0x274:
    ptVar13 = local_138;
    ptVar5 = local_238;
    node = node_00;
    goto LAB_00151d88;
  case 0x26a:
  case 0x27c:
    uVar1 = args->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      plVar3 = (long *)((ulong)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      plVar3 = (long *)args->overflow_arg_area;
      args->overflow_arg_area = plVar3 + 1;
    }
    pcVar9 = (char *)*plVar3;
    if ((char *)*plVar3 == (char *)0x0) goto LAB_00151d91;
LAB_00151ba1:
    pTVar2 = prvTidytidyMessageCreateWithLexer(doc,code,level,pcVar9);
    break;
  case 0x26b:
    uVar1 = args->gp_offset;
    uVar7 = (ulong)uVar1;
    if (uVar7 < 0x29) {
      args->gp_offset = uVar1 + 8;
      uVar10 = *(undefined8 *)((long)args->reg_save_area + uVar7);
      if (0x20 < uVar1) goto LAB_00151d27;
      args->gp_offset = (uint)(uVar7 + 0x10);
      uVar12 = *(undefined8 *)((long)args->reg_save_area + uVar7 + 8);
      if (0x18 < uVar1) goto LAB_00151d38;
      puVar6 = (undefined8 *)(uVar7 + 0x10 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 0x18;
    }
    else {
      puVar6 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = puVar6 + 1;
      uVar10 = *puVar6;
LAB_00151d27:
      puVar6 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = puVar6 + 1;
      uVar12 = *puVar6;
LAB_00151d38:
      puVar6 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = puVar6 + 1;
    }
    pTVar2 = prvTidytidyMessageCreateWithLexer(doc,0x26b,level,uVar10,uVar12,*puVar6);
    break;
  case 0x26c:
  case 0x277:
    uVar1 = args->gp_offset;
    uVar7 = (ulong)uVar1;
    if (uVar7 < 0x29) {
      args->gp_offset = (uint)(uVar7 + 8);
      uVar10 = *(undefined8 *)((long)args->reg_save_area + uVar7);
      if (0x20 < uVar1) goto LAB_00151bc8;
      puVar6 = (undefined8 *)(uVar7 + 8 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 0x10;
    }
    else {
      puVar6 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = puVar6 + 1;
      uVar10 = *puVar6;
LAB_00151bc8:
      puVar6 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = puVar6 + 1;
    }
    pTVar2 = prvTidytidyMessageCreateWithLexer(doc,code,level,uVar10,*puVar6);
    break;
  case 0x275:
    code = 0x275;
LAB_00151976:
    pTVar2 = prvTidytidyMessageCreateWithNode(doc,node,code,level);
    break;
  case 0x27b:
    pTVar2 = prvTidytidyMessageCreate(doc,0x27b,level);
    break;
  case 0x27e:
    ptVar5 = element->element;
    ptVar13 = local_238;
    code = 0x27e;
    goto LAB_00151d88;
  case 0x286:
    ptVar13 = node->element;
    ptVar5 = element->element;
    code = 0x286;
LAB_00151d88:
    pTVar2 = prvTidytidyMessageCreateWithNode(doc,node,code,level,ptVar13,ptVar5);
  }
  return pTVar2;
}

Assistant:

TidyMessageImpl *formatStandard(TidyDocImpl* doc, Node *element, Node *node, uint code, uint level, va_list args)
{
    char nodedesc[ 256 ] = {0};
    char elemdesc[ 256 ] = {0};
    Node* rpt = ( element ? element : node );

    TagToString(node, nodedesc, sizeof(nodedesc));

    if ( element )
        TagToString(element, elemdesc, sizeof(elemdesc));

    switch ( code )
    {
        case CUSTOM_TAG_DETECTED:
        {
            ctmbstr tagtype;
            switch ( cfg( doc, TidyUseCustomTags ) )
            {
                case TidyCustomBlocklevel:
                    tagtype = tidyLocalizedString( TIDYCUSTOMBLOCKLEVEL_STRING );
                    break;
                case TidyCustomEmpty:
                    tagtype = tidyLocalizedString( TIDYCUSTOMEMPTY_STRING );
                    break;
                case TidyCustomInline:
                    tagtype = tidyLocalizedString( TIDYCUSTOMINLINE_STRING );
                    break;
                case TidyCustomPre:
                default:
                    tagtype = tidyLocalizedString( TIDYCUSTOMPRE_STRING );
                    break;
            }
            return TY_(tidyMessageCreateWithNode)(doc, element, code, level, elemdesc, tagtype );
        }

        case STRING_NO_SYSID:
            return TY_(tidyMessageCreate)( doc, code, level );
            
        case FILE_CANT_OPEN:
        case FILE_CANT_OPEN_CFG:
        case FILE_NOT_FILE:
        case STRING_CONTENT_LOOKS:
        case STRING_DOCTYPE_GIVEN:
        case STRING_MISSING_MALFORMED:
        case STRING_MUTING_TYPE:
        {
            ctmbstr str;
            if ( (str = va_arg( args, ctmbstr)) )
                return TY_(tidyMessageCreate)( doc, code, level, str );

        } break;

        case APOS_UNDEFINED:
        case MISSING_SEMICOLON_NCR:
        case MISSING_SEMICOLON:
        case UNESCAPED_AMPERSAND:
        case UNKNOWN_ENTITY:
        {
            ctmbstr entityname;
            if ( !(entityname = va_arg( args, ctmbstr)) )
            {
                entityname = "NULL";
            }
            return TY_(tidyMessageCreateWithLexer)(doc, code, level, entityname);
        }

        case MISSING_ATTRIBUTE:
        {
            ctmbstr name;
            if ( (name = va_arg( args, ctmbstr)) )
                return TY_(tidyMessageCreateWithNode)(doc, node, code, level, nodedesc, name );
        } break;

        case STRING_UNKNOWN_OPTION:
        case OPTION_REMOVED:
        {
            ctmbstr str;
            if ( (str = va_arg( args, ctmbstr)) )
                return TY_(tidyMessageCreateWithLexer)(doc, code, level, str);
        } break;

        case OPTION_REMOVED_UNAPPLIED:
        case STRING_ARGUMENT_BAD:
        {
            ctmbstr s1 = va_arg( args, ctmbstr );
            ctmbstr s2 = va_arg( args, ctmbstr );
            return TY_(tidyMessageCreateWithLexer)(doc, code, level, s1, s2);
        }

        case OPTION_REMOVED_APPLIED:
        {
            ctmbstr s1 = va_arg( args, ctmbstr );
            ctmbstr s2 = va_arg( args, ctmbstr );
            ctmbstr s3 = va_arg( args, ctmbstr );
            return TY_(tidyMessageCreateWithLexer)(doc, code, level, s1, s2, s3);
        }


        case BAD_SURROGATE_LEAD:
        case BAD_SURROGATE_PAIR:
        case BAD_SURROGATE_TAIL:
        {
            uint c1 = va_arg( args, uint );
            uint c2 = va_arg( args, uint );
            return TY_(tidyMessageCreateWithLexer)(doc, code, level, c1, c2);
        }

        case SPACE_PRECEDING_XMLDECL:
            /* @TODO: Should this be a TidyInfo "silent" fix? */
            return TY_(tidyMessageCreateWithNode)(doc, node, code, level );

        case CANT_BE_NESTED:
        case NOFRAMES_CONTENT:
        case USING_BR_INPLACE_OF:
            /* Can we use `rpt` here? No; `element` has a value in every case. */
            return TY_(tidyMessageCreateWithNode)(doc, node, code, level, nodedesc );

        case ELEMENT_VERS_MISMATCH_ERROR:
        case ELEMENT_VERS_MISMATCH_WARN:
            return TY_(tidyMessageCreateWithNode)(doc, node, code, level, nodedesc, HTMLVersion(doc) );

        case TAG_NOT_ALLOWED_IN:
            /* Can we use `rpt` here? No; `element` has a value in every case. */
            return TY_(tidyMessageCreateWithNode)(doc, node, code, level, nodedesc, element->element );

        case INSERTING_TAG:
        case MISSING_STARTTAG:
        case TOO_MANY_ELEMENTS:
        case UNEXPECTED_ENDTAG:
        case UNEXPECTED_ENDTAG_ERR:  /* generated by XML docs */
            /* Can we use `rpt` here? No; `element` has a value in every case. */
            return TY_(tidyMessageCreateWithNode)(doc, node, code, level, node->element );

        case UNEXPECTED_ENDTAG_IN:
            /* Can we use `rpt` here? No; `element` has a value in every case. */
            return TY_(tidyMessageCreateWithNode)(doc, node, code, level, node->element, element->element );

        case BAD_CDATA_CONTENT:
        case CONTENT_AFTER_BODY:
        case DOCTYPE_AFTER_TAGS:
        case DUPLICATE_FRAMESET:
        case MALFORMED_COMMENT:
        case MALFORMED_COMMENT_DROPPING:
        case MALFORMED_COMMENT_EOS:
        case MALFORMED_COMMENT_WARN:
        case MALFORMED_DOCTYPE:
        case MISSING_DOCTYPE:
        case MISSING_TITLE_ELEMENT:
        case NESTED_QUOTATION:
        case SUSPECTED_MISSING_QUOTE:
        case XML_DECLARATION_DETECTED:
            return TY_(tidyMessageCreateWithNode)(doc, rpt, code, level );

        case ELEMENT_NOT_EMPTY:
        case FOUND_STYLE_IN_BODY:
        case ILLEGAL_NESTING:
        case MOVED_STYLE_TO_HEAD:
        case TRIM_EMPTY_ELEMENT:
        case UNEXPECTED_END_OF_FILE:
            return TY_(tidyMessageCreateWithNode)(doc, rpt, code, level, elemdesc );

        case OBSOLETE_ELEMENT:
        case REPLACING_ELEMENT:
        case REPLACING_UNEX_ELEMENT:
            return TY_(tidyMessageCreateWithNode)(doc, rpt, code, level, elemdesc, nodedesc );

        case ADDED_MISSING_CHARSET:
        case BAD_SUMMARY_HTML5:
        case NESTED_EMPHASIS:
        case PROPRIETARY_ELEMENT:
        case REMOVED_HTML5:
        case UNKNOWN_ELEMENT:
        case UNKNOWN_ELEMENT_LOOKS_CUSTOM:
            return TY_(tidyMessageCreateWithNode)(doc, rpt, code, level, nodedesc );

        case MISSING_ENDTAG_FOR:
        case MISSING_ENDTAG_OPTIONAL:
        case PREVIOUS_LOCATION:
            return TY_(tidyMessageCreateWithNode)(doc, rpt, code, level, element->element );

        case MISSING_ENDTAG_BEFORE:
            return TY_(tidyMessageCreateWithNode)(doc, rpt, code, level, element->element, nodedesc );

        case COERCE_TO_ENDTAG:
        case NON_MATCHING_ENDTAG:
        case TOO_MANY_ELEMENTS_IN:
            return TY_(tidyMessageCreateWithNode)(doc, rpt, code, level, node->element, node->element );
    }

    return NULL;
}